

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder.h
# Opt level: O1

NodeRef __thiscall
embree::sse2::BVHNBuilderVirtual<4>::
BVHNBuilderT<embree::sse2::CreateLeaf<4,_embree::TriangleMv<4>_>_>::createLeaf
          (BVHNBuilderT<embree::sse2::CreateLeaf<4,_embree::TriangleMv<4>_>_> *this,PrimRef *prims,
          range<unsigned_long> *set,Allocator *alloc)

{
  atomic<unsigned_long> *paVar1;
  undefined4 *puVar2;
  pointer *pppTVar3;
  uint uVar4;
  FastAllocator *this_00;
  ThreadLocal *pTVar5;
  ThreadLocal2 *this_01;
  iterator __position;
  Ref<embree::Geometry> *pRVar6;
  Geometry *pGVar7;
  long lVar8;
  RTCFilterFunctionN p_Var9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  ulong uVar19;
  char *pcVar20;
  char *pcVar21;
  size_t sVar22;
  long lVar23;
  unsigned_long uVar24;
  ulong uVar25;
  long lVar26;
  uint *puVar27;
  ulong uVar28;
  long lVar29;
  vuint<4> vgeomID;
  vuint<4> vprimID;
  MutexSys *local_108;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  ulong local_f8;
  PrimRef *local_f0;
  MutexSys *local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  ThreadLocal2 *local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  ThreadLocal2 *local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  long local_58;
  BVHNBuilderT<embree::sse2::CreateLeaf<4,_embree::TriangleMv<4>_>_> *local_50;
  uint local_48 [6];
  
  uVar24 = set->_begin;
  uVar19 = (set->_end - uVar24) + 3;
  local_f8 = uVar19 >> 2;
  local_108 = (MutexSys *)(local_f8 * 0xb0);
  this_00 = alloc->alloc;
  pTVar5 = alloc->talloc1;
  this_01 = pTVar5->parent;
  local_f0 = prims;
  if (this_00 != (this_01->alloc)._M_b._M_p) {
    uStack_b0 = CONCAT71(uStack_b0._1_7_,1);
    local_b8 = this_01;
    MutexSys::lock(&this_01->mutex);
    if ((this_01->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesUsed + (this_01->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_01->alloc0).end + (this_01->alloc1).end) -
           ((this_01->alloc0).cur + (this_01->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesWasted + (this_01->alloc0).bytesWasted;
      UNLOCK();
    }
    (this_01->alloc0).bytesUsed = 0;
    (this_01->alloc0).bytesWasted = 0;
    (this_01->alloc0).end = 0;
    (this_01->alloc0).allocBlockSize = 0;
    (this_01->alloc0).ptr = (char *)0x0;
    (this_01->alloc0).cur = 0;
    if (this_00 == (FastAllocator *)0x0) {
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
    }
    else {
      (this_01->alloc0).allocBlockSize = this_00->defaultBlockSize;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).allocBlockSize = this_00->defaultBlockSize;
    }
    LOCK();
    (this_01->alloc)._M_b._M_p = this_00;
    UNLOCK();
    local_e8 = (MutexSys *)&FastAllocator::s_thread_local_allocators_lock;
    uStack_e0 = CONCAT71(uStack_e0._1_7_,1);
    local_88 = this_01;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    __position._M_current =
         (this_00->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this_00->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&this_00->thread_local_allocators,__position,&local_88);
    }
    else {
      *__position._M_current = local_88;
      pppTVar3 = &(this_00->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar3 = *pppTVar3 + 1;
    }
    if ((char)uStack_e0 == '\x01') {
      MutexSys::unlock(local_e8);
    }
    if ((char)uStack_b0 == '\x01') {
      MutexSys::unlock(&local_b8->mutex);
    }
  }
  pTVar5->bytesUsed = (long)&local_108->mutex + pTVar5->bytesUsed;
  sVar22 = pTVar5->cur;
  uVar25 = (ulong)(-(int)sVar22 & 0xf);
  uVar28 = (long)&local_108->mutex + uVar25 + sVar22;
  pTVar5->cur = uVar28;
  if (pTVar5->end < uVar28) {
    pTVar5->cur = sVar22;
    if ((MutexSys *)pTVar5->allocBlockSize < (MutexSys *)((long)local_108 << 2)) {
      pcVar20 = (char *)FastAllocator::malloc(this_00,(size_t)&local_108);
    }
    else {
      local_e8 = (MutexSys *)pTVar5->allocBlockSize;
      pcVar20 = (char *)FastAllocator::malloc(this_00,(size_t)&local_e8);
      pTVar5->ptr = pcVar20;
      sVar22 = (pTVar5->end - pTVar5->cur) + pTVar5->bytesWasted;
      pTVar5->bytesWasted = sVar22;
      pTVar5->cur = 0;
      pTVar5->end = (size_t)local_e8;
      pTVar5->cur = (size_t)local_108;
      if (local_e8 < local_108) {
        pTVar5->cur = 0;
        local_e8 = (MutexSys *)pTVar5->allocBlockSize;
        pcVar20 = (char *)FastAllocator::malloc(this_00,(size_t)&local_e8);
        pTVar5->ptr = pcVar20;
        sVar22 = (pTVar5->end - pTVar5->cur) + pTVar5->bytesWasted;
        pTVar5->bytesWasted = sVar22;
        pTVar5->cur = 0;
        pTVar5->end = (size_t)local_e8;
        pTVar5->cur = (size_t)local_108;
        if (local_e8 < local_108) {
          pTVar5->cur = 0;
          pcVar20 = (char *)0x0;
        }
        else {
          pTVar5->bytesWasted = sVar22;
        }
      }
      else {
        pTVar5->bytesWasted = sVar22;
      }
    }
  }
  else {
    pTVar5->bytesWasted = pTVar5->bytesWasted + uVar25;
    pcVar20 = pTVar5->ptr + (uVar28 - (long)local_108);
  }
  if (3 < uVar19) {
    lVar26 = local_f8 + (local_f8 == 0);
    local_f0 = (PrimRef *)((long)&(local_f0->upper).field_0 + 0xc);
    lVar23 = 0;
    local_58 = lVar26;
    local_50 = this;
    do {
      uVar19 = set->_end;
      local_108 = (MutexSys *)0xffffffffffffffff;
      uStack_100 = 0xffffffff;
      uStack_fc = 0xffffffff;
      local_48[0] = 0xffffffff;
      local_48[1] = 0xffffffff;
      local_48[2] = 0xffffffff;
      local_48[3] = 0xffffffff;
      local_c8 = 0;
      uStack_c0 = 0;
      local_d8 = 0;
      uStack_d0 = 0;
      local_e8 = (MutexSys *)0x0;
      uStack_e0 = 0;
      local_98 = 0;
      uStack_90 = 0;
      local_a8 = 0;
      uStack_a0 = 0;
      local_b8 = (ThreadLocal2 *)0x0;
      uStack_b0 = 0;
      local_68 = 0;
      uStack_60 = 0;
      local_78 = 0;
      uStack_70 = 0;
      local_88 = (ThreadLocal2 *)0x0;
      uStack_80 = 0;
      if (uVar24 < uVar19) {
        pRVar6 = (((this->createLeafFunc).bvh)->scene->geometries).items;
        puVar27 = (uint *)((long)local_f0 + uVar24 * 0x20);
        uVar28 = 0;
        do {
          uVar4 = *puVar27;
          pGVar7 = pRVar6[puVar27[-4]].ptr;
          lVar29 = (ulong)uVar4 *
                   pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
          lVar26 = *(long *)&pGVar7->field_0x58;
          lVar8 = *(long *)&pGVar7[1].time_range.upper;
          p_Var9 = pGVar7[1].intersectionFilterN;
          puVar2 = (undefined4 *)(lVar8 + (ulong)*(uint *)(lVar26 + lVar29) * (long)p_Var9);
          uVar10 = *puVar2;
          uVar11 = puVar2[1];
          uVar12 = puVar2[2];
          puVar2 = (undefined4 *)(lVar8 + (ulong)*(uint *)(lVar26 + 4 + lVar29) * (long)p_Var9);
          uVar13 = *puVar2;
          uVar14 = puVar2[1];
          uVar15 = puVar2[2];
          puVar2 = (undefined4 *)(lVar8 + (ulong)*(uint *)(lVar26 + 8 + lVar29) * (long)p_Var9);
          uVar16 = *puVar2;
          uVar17 = puVar2[1];
          uVar18 = puVar2[2];
          *(uint *)((long)&local_108 + uVar28 * 4) = puVar27[-4];
          local_48[uVar28] = uVar4;
          *(undefined4 *)((long)&local_e8 + uVar28 * 4) = uVar10;
          *(undefined4 *)((long)&local_d8 + uVar28 * 4) = uVar11;
          *(undefined4 *)((long)&local_c8 + uVar28 * 4) = uVar12;
          *(undefined4 *)((long)&local_b8 + uVar28 * 4) = uVar13;
          *(undefined4 *)((long)&local_a8 + uVar28 * 4) = uVar14;
          *(undefined4 *)((long)&local_98 + uVar28 * 4) = uVar15;
          *(undefined4 *)((long)&local_88 + uVar28 * 4) = uVar16;
          *(undefined4 *)((long)&local_78 + uVar28 * 4) = uVar17;
          *(undefined4 *)((long)&local_68 + uVar28 * 4) = uVar18;
          uVar25 = uVar28 + 1;
          if (2 < uVar28) break;
          lVar26 = uVar28 + uVar24;
          puVar27 = puVar27 + 8;
          uVar28 = uVar25;
        } while (lVar26 + 1U < uVar19);
        uVar24 = uVar24 + uVar25;
        lVar26 = local_58;
        this = local_50;
      }
      pcVar21 = pcVar20 + lVar23 * 0xb0;
      *(MutexSys **)pcVar21 = local_e8;
      *(undefined8 *)(pcVar21 + 8) = uStack_e0;
      *(undefined8 *)(pcVar21 + 0x10) = local_d8;
      *(undefined8 *)(pcVar21 + 0x18) = uStack_d0;
      *(undefined8 *)(pcVar21 + 0x20) = local_c8;
      *(undefined8 *)(pcVar21 + 0x28) = uStack_c0;
      *(ThreadLocal2 **)(pcVar21 + 0x30) = local_b8;
      *(undefined8 *)(pcVar21 + 0x38) = uStack_b0;
      *(undefined8 *)(pcVar21 + 0x40) = local_a8;
      *(undefined8 *)(pcVar21 + 0x48) = uStack_a0;
      *(undefined8 *)(pcVar21 + 0x50) = local_98;
      *(undefined8 *)(pcVar21 + 0x58) = uStack_90;
      *(ThreadLocal2 **)(pcVar21 + 0x60) = local_88;
      *(undefined8 *)(pcVar21 + 0x68) = uStack_80;
      *(undefined8 *)(pcVar21 + 0x70) = local_78;
      *(undefined8 *)(pcVar21 + 0x78) = uStack_70;
      *(undefined8 *)(pcVar21 + 0x80) = local_68;
      *(undefined8 *)(pcVar21 + 0x88) = uStack_60;
      *(MutexSys **)(pcVar21 + 0x90) = local_108;
      *(ulong *)(pcVar21 + 0x98) = CONCAT44(uStack_fc,uStack_100);
      *(ulong *)(pcVar21 + 0xa0) = CONCAT44(local_48[1],local_48[0]);
      *(ulong *)(pcVar21 + 0xa8) = CONCAT44(local_48[3],local_48[2]);
      lVar23 = lVar23 + 1;
    } while (lVar23 != lVar26);
  }
  uVar19 = 7;
  if (local_f8 < 7) {
    uVar19 = local_f8;
  }
  return (NodeRef)(uVar19 | (ulong)pcVar20 | 8);
}

Assistant:

NodeRef createLeaf (const PrimRef* prims, const range<size_t>& set, const Allocator& alloc) {
            return createLeafFunc(prims,set,alloc);
          }